

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall TimerManager::~TimerManager(TimerManager *this)

{
  uint uVar1;
  Timer **ppTVar2;
  uint local_14;
  uint i;
  TimerManager *this_local;
  
  SmartPtr<Timer>::operator=(&this->mDefaultTimer,(Timer *)0x0);
  local_14 = 0;
  while( true ) {
    uVar1 = JetHead::vector<Timer_*>::size(&this->mTimers);
    if (uVar1 <= local_14) break;
    ppTVar2 = JetHead::vector<Timer_*>::operator[](&this->mTimers,local_14);
    jh_log_print(2,"TimerManager::~TimerManager()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/TimerManager.cpp"
                 ,0x51,"Possibly leaked Timer %p\n",*ppTVar2);
    local_14 = local_14 + 1;
  }
  Mutex::~Mutex(&this->mMutex);
  JetHead::vector<Timer_*>::~vector(&this->mTimers);
  SmartPtr<Timer>::~SmartPtr(&this->mDefaultTimer);
  return;
}

Assistant:

TimerManager::~TimerManager()
{
	TRACE_BEGIN(LOG_LVL_NOTICE);
	
	// Release reference to default timer
	mDefaultTimer = NULL;
	
	// At this point all outstanding timers should be
	// gone.  If we still have a timer in our list then
	// log a warning but do not do anything to the memory
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		LOG_WARN("Possibly leaked Timer %p\n", mTimers[i]);
	}
}